

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeModel::QTreeModel(QTreeModel *this,int columns,QTreeWidget *parent)

{
  QAbstractItemModelPrivate *this_00;
  QTreeWidgetItem *pQVar1;
  
  this_00 = (QAbstractItemModelPrivate *)operator_new(0xd8);
  QAbstractItemModelPrivate::QAbstractItemModelPrivate(this_00);
  *(undefined ***)this_00 = &PTR__QAbstractItemModelPrivate_0081ed80;
  QAbstractItemModel::QAbstractItemModel(&this->super_QAbstractItemModel,this_00,(QObject *)parent);
  *(undefined ***)this = &PTR_metaObject_0081e658;
  pQVar1 = (QTreeWidgetItem *)operator_new(0x60);
  QTreeWidgetItem::QTreeWidgetItem(pQVar1,0);
  this->rootItem = pQVar1;
  pQVar1 = (QTreeWidgetItem *)operator_new(0x60);
  QTreeWidgetItem::QTreeWidgetItem(pQVar1,0);
  this->headerItem = pQVar1;
  (this->cachedIndexes).d.d = (Data *)0x0;
  (this->cachedIndexes).d.ptr = (QModelIndex *)0x0;
  (this->cachedIndexes).d.size = 0;
  (this->iterators).d.d = (Data *)0x0;
  (this->iterators).d.ptr = (QTreeWidgetItemIterator **)0x0;
  (this->iterators).d.size = 0;
  *(undefined8 *)((long)&(this->iterators).d.size + 5) = 0;
  pQVar1 = this->rootItem;
  pQVar1->view = parent;
  (pQVar1->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = 8;
  this->headerItem->view = parent;
  setColumnCount(this,columns);
  return;
}

Assistant:

QTreeModel::QTreeModel(int columns, QTreeWidget *parent)
    : QAbstractItemModel(*new QTreeModelPrivate, parent),
      rootItem(new QTreeWidgetItem),
      headerItem(new QTreeWidgetItem)
{
    rootItem->view = parent;
    rootItem->itemFlags = Qt::ItemIsDropEnabled;
    headerItem->view = parent;
    setColumnCount(columns);
}